

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

aggregate_state_t * duckdb::AggregateStateType::GetStateType(LogicalType *type)

{
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_10;
  
  local_10.ptr = (type->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_10);
  return (aggregate_state_t *)(local_10.ptr + 1);
}

Assistant:

LogicalType LogicalType::ForceMaxLogicalType(const LogicalType &left, const LogicalType &right) {
	LogicalType result;
	if (TryGetMaxLogicalTypeInternal<ForceGetTypeOperation>(left, right, result)) {
		return result;
	}
	// we prefer the type with the highest score
	auto left_score = GetLogicalTypeScore(left);
	auto right_score = GetLogicalTypeScore(right);
	if (left_score < right_score) {
		return right;
	} else {
		return left;
	}
}